

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  string *this_00;
  TestCase *pTVar1;
  bool bVar2;
  TestCase *pTVar3;
  reference ppTVar4;
  char *pcVar5;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar6;
  TestInfo *pTVar7;
  reference ppTVar8;
  bool local_111;
  bool local_107;
  bool local_106;
  bool local_105;
  bool local_102;
  Int32 local_c0;
  Int32 local_bc;
  allocator local_a9;
  undefined1 local_a8 [3];
  bool is_selected;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  allocator local_61;
  string local_60;
  string *local_40;
  string *test_case_name;
  TestCase *test_case;
  size_t i;
  int local_20;
  int num_selected_tests;
  int num_runnable_tests;
  Int32 shard_index;
  Int32 total_shards;
  ReactionToSharding shard_tests_local;
  UnitTestImpl *this_local;
  
  shard_index = shard_tests;
  _total_shards = this;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_bc = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
  }
  else {
    local_bc = -1;
  }
  num_runnable_tests = local_bc;
  if (shard_index == 0) {
    local_c0 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_c0 = -1;
  }
  num_selected_tests = local_c0;
  local_20 = 0;
  i._4_4_ = 0;
  test_case = (TestCase *)0x0;
  while( true ) {
    pTVar1 = test_case;
    pTVar3 = (TestCase *)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                       (&this->test_cases_);
    if (pTVar3 <= pTVar1) break;
    ppTVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,(size_type)test_case);
    test_case_name = (string *)*ppTVar4;
    pcVar5 = TestCase::name((TestCase *)test_case_name);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar5,&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_40 = &local_60;
    TestCase::set_should_run((TestCase *)test_case_name,false);
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar6 = TestCase::test_info_list((TestCase *)test_case_name);
      pTVar7 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar6);
      if (pTVar7 <= test_info) break;
      pvVar6 = TestCase::test_info_list((TestCase *)test_case_name);
      ppTVar8 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar6,(size_type)test_info);
      test_name.field_2._8_8_ = *ppTVar8;
      pcVar5 = TestInfo::name((TestInfo *)test_name.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_a8,pcVar5,&local_a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      bVar2 = UnitTestOptions::MatchesFilter(local_40,"DISABLED_*:*/DISABLED_*");
      local_102 = true;
      if (!bVar2) {
        local_102 = UnitTestOptions::MatchesFilter((string *)local_a8,"DISABLED_*:*/DISABLED_*");
      }
      *(bool *)(test_name.field_2._8_8_ + 0x59) = local_102;
      bVar2 = UnitTestOptions::FilterMatchesTest(local_40,(string *)local_a8);
      *(bool *)(test_name.field_2._8_8_ + 0x5a) = bVar2;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_105 = false, local_102 == false)) {
        local_105 = bVar2;
      }
      local_106 = false;
      if (local_105 != false) {
        local_107 = true;
        if (shard_index != 1) {
          local_107 = ShouldRunTestOnShard(num_runnable_tests,num_selected_tests,local_20);
        }
        local_106 = local_107;
      }
      this_00 = test_case_name;
      local_20 = local_20 + (uint)local_105;
      i._4_4_ = i._4_4_ + (uint)local_106;
      *(bool *)(test_name.field_2._8_8_ + 0x58) = local_106;
      bVar2 = TestCase::should_run((TestCase *)test_case_name);
      local_111 = true;
      if (!bVar2) {
        local_111 = local_106;
      }
      TestCase::set_should_run((TestCase *)this_00,local_111);
      std::__cxx11::string::~string((string *)local_a8);
      test_info = (TestInfo *)&(test_info->test_case_name_).field_0x1;
    }
    std::__cxx11::string::~string((string *)&local_60);
    test_case = (TestCase *)((long)&test_case->_vptr_TestCase + 1);
  }
  return i._4_4_;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const std::string &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_selected = is_runnable &&
          (shard_tests == IGNORE_SHARDING_PROTOCOL ||
           ShouldRunTestOnShard(total_shards, shard_index,
                                num_runnable_tests));

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}